

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.c
# Opt level: O0

void * malloc(size_t __size)

{
  mchunkptr pmVar1;
  malloc_chunk *pmVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  ulong uVar6;
  mchunkptr pmVar7;
  byte bVar8;
  bool bVar9;
  ulong local_f0;
  mchunkptr r_2;
  mchunkptr p_3;
  size_t rsize_2;
  size_t dvs;
  mchunkptr r_1;
  mchunkptr p_2;
  size_t rsize_1;
  mchunkptr F_2;
  mchunkptr B;
  bindex_t I;
  mchunkptr DV;
  size_t DVS;
  mchunkptr F_1;
  uint J;
  binmap_t leastbit;
  binmap_t leftbits;
  bindex_t i;
  size_t rsize;
  mchunkptr r;
  mchunkptr p_1;
  mchunkptr b_1;
  mchunkptr F;
  mchunkptr p;
  mchunkptr b;
  binmap_t smallbits;
  bindex_t idx;
  size_t nb;
  void *mem;
  size_t bytes_local;
  
  if (mparams.magic == 0) {
    init_mparams();
  }
  iVar3 = _gm_.mutex;
  if ((_gm_.mflags & 2) != 0) {
    LOCK();
    _gm_.mutex = 1;
    UNLOCK();
    if ((iVar3 != 0) && (iVar3 = spin_acquire_lock(&_gm_.mutex), iVar3 != 0)) {
      return (void *)0x0;
    }
  }
  if (__size < 0xe9) {
    if (__size < 0x17) {
      local_f0 = 0x20;
    }
    else {
      local_f0 = __size + 0x17 & 0xfffffffffffffff0;
    }
    _smallbits = local_f0;
    bVar8 = (byte)(local_f0 >> 3);
    uVar4 = _gm_.smallmap >> (bVar8 & 0x1f);
    if ((uVar4 & 3) != 0) {
      iVar3 = ((uVar4 ^ 0xffffffff) & 1) + (int)(local_f0 >> 3);
      uVar6 = (ulong)(uint)(iVar3 * 2);
      pmVar1 = _gm_.smallbins[uVar6 + 2];
      pmVar2 = pmVar1->fd;
      if ((malloc_chunk *)(_gm_.smallbins + uVar6) == pmVar2) {
        _gm_.smallmap = (1 << ((byte)iVar3 & 0x1f) ^ 0xffffffffU) & _gm_.smallmap;
      }
      else {
        bVar9 = false;
        if (_gm_.least_addr <= pmVar2) {
          bVar9 = pmVar2->bk == pmVar1;
        }
        if (!bVar9) {
          abort();
        }
        pmVar2->bk = (malloc_chunk *)(_gm_.smallbins + uVar6);
        _gm_.smallbins[uVar6 + 2] = pmVar2;
      }
      pmVar1->head = (ulong)(uint)(iVar3 * 8) | 3;
      *(ulong *)((long)&pmVar1->head + (ulong)(uint)(iVar3 * 8)) =
           *(ulong *)((long)&pmVar1->head + (ulong)(uint)(iVar3 * 8)) | 1;
      nb = (size_t)&pmVar1->fd;
      goto LAB_0010b55b;
    }
    if (_gm_.dvsize < local_f0) {
      if (uVar4 != 0) {
        uVar4 = uVar4 << (bVar8 & 0x1f) & ((1 << (bVar8 & 0x1f)) << 1 | (1 << (bVar8 & 0x1f)) * -2);
        iVar3 = 0;
        for (uVar4 = uVar4 & -uVar4; (uVar4 & 1) == 0; uVar4 = uVar4 >> 1 | 0x80000000) {
          iVar3 = iVar3 + 1;
        }
        uVar6 = (ulong)(uint)(iVar3 << 1);
        pmVar1 = _gm_.smallbins[uVar6 + 2];
        pmVar2 = pmVar1->fd;
        if ((malloc_chunk *)(_gm_.smallbins + uVar6) == pmVar2) {
          _gm_.smallmap = (1 << ((byte)iVar3 & 0x1f) ^ 0xffffffffU) & _gm_.smallmap;
        }
        else {
          bVar9 = false;
          if (_gm_.least_addr <= pmVar2) {
            bVar9 = pmVar2->bk == pmVar1;
          }
          if (!bVar9) {
            abort();
          }
          pmVar2->bk = (malloc_chunk *)(_gm_.smallbins + uVar6);
          _gm_.smallbins[uVar6 + 2] = pmVar2;
        }
        sVar5 = (uint)(iVar3 << 3) - local_f0;
        if (sVar5 < 0x20) {
          pmVar1->head = (ulong)(uint)(iVar3 << 3) | 3;
          *(ulong *)((long)&pmVar1->head + (ulong)(uint)(iVar3 << 3)) =
               *(ulong *)((long)&pmVar1->head + (ulong)(uint)(iVar3 << 3)) | 1;
          sVar5 = _gm_.dvsize;
          pmVar7 = _gm_.dv;
        }
        else {
          pmVar1->head = local_f0 | 3;
          pmVar7 = (mchunkptr)((long)&pmVar1->prev_foot + local_f0);
          pmVar7->head = sVar5 | 1;
          *(size_t *)((long)pmVar7 + sVar5) = sVar5;
          if (_gm_.dvsize != 0) {
            uVar6 = (ulong)(uint)((int)(_gm_.dvsize >> 3) << 1);
            bVar8 = (byte)(_gm_.dvsize >> 3);
            if ((_gm_.smallmap & 1 << (bVar8 & 0x1f)) == 0) {
              _gm_.smallmap = 1 << (bVar8 & 0x1f) | _gm_.smallmap;
              rsize_1 = (size_t)(_gm_.smallbins + uVar6);
            }
            else {
              if (_gm_.smallbins[uVar6 + 2] < _gm_.least_addr) {
                abort();
              }
              rsize_1 = (size_t)_gm_.smallbins[uVar6 + 2];
            }
            _gm_.smallbins[uVar6 + 2] = _gm_.dv;
            *(mchunkptr *)(rsize_1 + 0x18) = _gm_.dv;
            (_gm_.dv)->fd = (malloc_chunk *)rsize_1;
            (_gm_.dv)->bk = (malloc_chunk *)(_gm_.smallbins + uVar6);
          }
        }
        _gm_.dv = pmVar7;
        _gm_.dvsize = sVar5;
        nb = (size_t)&pmVar1->fd;
        goto LAB_0010b55b;
      }
      if (_gm_.treemap != 0) {
        nb = (size_t)tmalloc_small(&_gm_,local_f0);
        goto joined_r0x0010b390;
      }
    }
  }
  else if (__size < 0xffffffffffffff80) {
    _smallbits = __size + 0x17 & 0xfffffffffffffff0;
    if (_gm_.treemap != 0) {
      nb = (size_t)tmalloc_large(&_gm_,_smallbits);
joined_r0x0010b390:
      if ((void *)nb != (void *)0x0) goto LAB_0010b55b;
    }
  }
  else {
    _smallbits = 0xffffffffffffffff;
  }
  pmVar7 = _gm_.top;
  pmVar1 = _gm_.dv;
  sVar5 = _gm_.dvsize;
  if (_gm_.dvsize < _smallbits) {
    if (_smallbits < _gm_.topsize) {
      _gm_.topsize = _gm_.topsize - _smallbits;
      _gm_.top = (mchunkptr)((long)&(_gm_.top)->prev_foot + _smallbits);
      (_gm_.top)->head = _gm_.topsize | 1;
      pmVar7->head = _smallbits | 3;
      nb = (size_t)&pmVar7->fd;
    }
    else {
      nb = (size_t)sys_alloc(&_gm_,_smallbits);
    }
  }
  else {
    uVar6 = _gm_.dvsize - _smallbits;
    if (uVar6 < 0x20) {
      _gm_.dvsize = 0;
      _gm_.dv = (mchunkptr)0x0;
      pmVar1->head = sVar5 | 3;
      *(ulong *)((long)&pmVar1->head + sVar5) = *(ulong *)((long)&pmVar1->head + sVar5) | 1;
    }
    else {
      pmVar7 = (mchunkptr)((long)&(_gm_.dv)->prev_foot + _smallbits);
      _gm_.dvsize = uVar6;
      _gm_.dv = pmVar7;
      pmVar7->head = uVar6 | 1;
      *(ulong *)((long)pmVar7 + uVar6) = uVar6;
      pmVar1->head = _smallbits | 3;
    }
    nb = (size_t)&pmVar1->fd;
  }
LAB_0010b55b:
  if ((_gm_.mflags & 2) != 0) {
    _gm_.mutex = 0;
  }
  return (void *)nb;
}

Assistant:

void* dlmalloc(size_t bytes) {
  /*
     Basic algorithm:
     If a small request (< 256 bytes minus per-chunk overhead):
       1. If one exists, use a remainderless chunk in associated smallbin.
          (Remainderless means that there are too few excess bytes to
          represent as a chunk.)
       2. If it is big enough, use the dv chunk, which is normally the
          chunk adjacent to the one used for the most recent small request.
       3. If one exists, split the smallest available chunk in a bin,
          saving remainder in dv.
       4. If it is big enough, use the top chunk.
       5. If available, get memory from system and use it
     Otherwise, for a large request:
       1. Find the smallest available binned chunk that fits, and use it
          if it is better fitting than dv chunk, splitting if necessary.
       2. If better fitting than any binned chunk, use the dv chunk.
       3. If it is big enough, use the top chunk.
       4. If request size >= mmap threshold, try to directly mmap this chunk.
       5. If available, get memory from system and use it

     The ugly goto's here ensure that postaction occurs along all paths.
  */

#if USE_LOCKS
  ensure_initialization(); /* initialize in sys_alloc if not using locks */
#endif

  if (!PREACTION(gm)) {
    void* mem;
    size_t nb;
    if (bytes <= MAX_SMALL_REQUEST) {
      bindex_t idx;
      binmap_t smallbits;
      nb = (bytes < MIN_REQUEST)? MIN_CHUNK_SIZE : pad_request(bytes);
      idx = small_index(nb);
      smallbits = gm->smallmap >> idx;

      if ((smallbits & 0x3U) != 0) { /* Remainderless fit to a smallbin. */
        mchunkptr b, p;
        idx += ~smallbits & 1;       /* Uses next bin if idx empty */
        b = smallbin_at(gm, idx);
        p = b->fd;
        assert(chunksize(p) == small_index2size(idx));
        unlink_first_small_chunk(gm, b, p, idx);
        set_inuse_and_pinuse(gm, p, small_index2size(idx));
        mem = chunk2mem(p);
        check_malloced_chunk(gm, mem, nb);
        goto postaction;
      }

      else if (nb > gm->dvsize) {
        if (smallbits != 0) { /* Use chunk in next nonempty smallbin */
          mchunkptr b, p, r;
          size_t rsize;
          bindex_t i;
          binmap_t leftbits = (smallbits << idx) & left_bits(idx2bit(idx));
          binmap_t leastbit = least_bit(leftbits);
          compute_bit2idx(leastbit, i);
          b = smallbin_at(gm, i);
          p = b->fd;
          assert(chunksize(p) == small_index2size(i));
          unlink_first_small_chunk(gm, b, p, i);
          rsize = small_index2size(i) - nb;
          /* Fit here cannot be remainderless if 4byte sizes */
          if (SIZE_T_SIZE != 4 && rsize < MIN_CHUNK_SIZE)
            set_inuse_and_pinuse(gm, p, small_index2size(i));
          else {
            set_size_and_pinuse_of_inuse_chunk(gm, p, nb);
            r = chunk_plus_offset(p, nb);
            set_size_and_pinuse_of_free_chunk(r, rsize);
            replace_dv(gm, r, rsize);
          }
          mem = chunk2mem(p);
          check_malloced_chunk(gm, mem, nb);
          goto postaction;
        }

        else if (gm->treemap != 0 && (mem = tmalloc_small(gm, nb)) != 0) {
          check_malloced_chunk(gm, mem, nb);
          goto postaction;
        }
      }
    }
    else if (bytes >= MAX_REQUEST)
      nb = MAX_SIZE_T; /* Too big to allocate. Force failure (in sys alloc) */
    else {
      nb = pad_request(bytes);
      if (gm->treemap != 0 && (mem = tmalloc_large(gm, nb)) != 0) {
        check_malloced_chunk(gm, mem, nb);
        goto postaction;
      }
    }

    if (nb <= gm->dvsize) {
      size_t rsize = gm->dvsize - nb;
      mchunkptr p = gm->dv;
      if (rsize >= MIN_CHUNK_SIZE) { /* split dv */
        mchunkptr r = gm->dv = chunk_plus_offset(p, nb);
        gm->dvsize = rsize;
        set_size_and_pinuse_of_free_chunk(r, rsize);
        set_size_and_pinuse_of_inuse_chunk(gm, p, nb);
      }
      else { /* exhaust dv */
        size_t dvs = gm->dvsize;
        gm->dvsize = 0;
        gm->dv = 0;
        set_inuse_and_pinuse(gm, p, dvs);
      }
      mem = chunk2mem(p);
      check_malloced_chunk(gm, mem, nb);
      goto postaction;
    }

    else if (nb < gm->topsize) { /* Split top */
      size_t rsize = gm->topsize -= nb;
      mchunkptr p = gm->top;
      mchunkptr r = gm->top = chunk_plus_offset(p, nb);
      r->head = rsize | PINUSE_BIT;
      set_size_and_pinuse_of_inuse_chunk(gm, p, nb);
      mem = chunk2mem(p);
      check_top_chunk(gm, gm->top);
      check_malloced_chunk(gm, mem, nb);
      goto postaction;
    }

    mem = sys_alloc(gm, nb);

  postaction:
    POSTACTION(gm);
    return mem;
  }

  return 0;
}